

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O0

int32 __thiscall
rw::PluginList::registerPlugin
          (PluginList *this,int32 size,uint32 id,Constructor ctor,Destructor dtor,
          CopyConstructor copy)

{
  int32 *piVar1;
  CopyConstructor local_60;
  Destructor local_58;
  Constructor local_50;
  int32 round;
  Plugin *p;
  CopyConstructor copy_local;
  Destructor dtor_local;
  Constructor ctor_local;
  uint32 id_local;
  int32 size_local;
  PluginList *this_local;
  
  piVar1 = (int32 *)malloc_LOC(0x78,0x40000,
                               "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/plg.cpp line: 171"
                              );
  *piVar1 = this->size;
  this->size = size + this->size;
  this->size = this->size + 7U & 0xfffffff8;
  piVar1[1] = size;
  piVar1[2] = id;
  local_50 = ctor;
  if (ctor == (Constructor)0x0) {
    local_50 = defCtor;
  }
  *(Constructor *)(piVar1 + 4) = local_50;
  local_58 = dtor;
  if (dtor == (Destructor)0x0) {
    local_58 = defDtor;
  }
  *(Destructor *)(piVar1 + 6) = local_58;
  local_60 = copy;
  if (copy == (CopyConstructor)0x0) {
    local_60 = defCopy;
  }
  *(CopyConstructor *)(piVar1 + 8) = local_60;
  piVar1[10] = 0;
  piVar1[0xb] = 0;
  piVar1[0xc] = 0;
  piVar1[0xd] = 0;
  piVar1[0xe] = 0;
  piVar1[0xf] = 0;
  piVar1[0x10] = 0;
  piVar1[0x11] = 0;
  piVar1[0x12] = 0;
  piVar1[0x13] = 0;
  *(PluginList **)(piVar1 + 0x14) = this;
  LinkList::add(&this->plugins,(LLLink *)(piVar1 + 0x16));
  LinkList::add((LinkList *)&allPlugins,(LLLink *)(piVar1 + 0x1a));
  return *piVar1;
}

Assistant:

int32
PluginList::registerPlugin(int32 size, uint32 id,
	Constructor ctor, Destructor dtor, CopyConstructor copy)
{
	Plugin *p = (Plugin*)rwMalloc(sizeof(Plugin), MEMDUR_GLOBAL);
	p->offset = this->size;
	this->size += size;
	int32 round = sizeof(void*)-1;
	this->size = (this->size + round)&~round;

	p->size = size;
	p->id = id;
	p->constructor = ctor ? ctor : defCtor;
	p->destructor = dtor ? dtor : defDtor;
	p->copy = copy ? copy : defCopy;
	p->read = nil;
	p->write = nil;
	p->getSize = nil;
	p->rightsCallback = nil;
	p->alwaysCallback = nil;
	p->parentList = this;
	this->plugins.add(&p->inParentList);
	allPlugins.add(&p->inGlobalList);
	return p->offset;
}